

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LagrangePolynomial.cpp
# Opt level: O0

int64_t __thiscall
LagrangePolynomial::find_product(LagrangePolynomial *this,vector<int,_std::allocator<int>_> *data)

{
  size_type sVar1;
  reference pvVar2;
  undefined4 local_24;
  long lStack_20;
  int i;
  int64_t result;
  vector<int,_std::allocator<int>_> *data_local;
  LagrangePolynomial *this_local;
  
  lStack_20 = 1;
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(data);
    if (sVar1 <= (ulong)(long)local_24) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](data,(long)local_24);
    lStack_20 = lStack_20 * *pvVar2;
    local_24 = local_24 + 1;
  }
  return lStack_20;
}

Assistant:

int64_t LagrangePolynomial::find_product(vector<int> data) {
    // returns product of vector<int> data
    // used to find the product of all denominators of the basis polynomial
    int64_t  result = 1;

    for(int i=0; i<data.size(); i++){
        result = result * data[i];
    }
    return result;
}